

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_diff_compare(lyd_node *first,lyd_node *second,lyd_difflist *diff,uint *size,uint *i,
                    ly_set *matchset,ly_set *ordset,int options)

{
  LYS_NODE LVar1;
  uint uVar2;
  lyd_difflist *plVar3;
  int iVar4;
  lys_node *plVar5;
  lyd_node **pplVar6;
  LY_ERR *pLVar7;
  lyd_node_anydata *anydata;
  char *str2;
  char *str1;
  ly_set *plStack_40;
  int rc;
  ly_set *matchset_local;
  uint *i_local;
  uint *size_local;
  lyd_difflist *diff_local;
  lyd_node *second_local;
  lyd_node *first_local;
  
  str2 = (char *)0x0;
  anydata = (lyd_node_anydata *)0x0;
  if (((first->field_0x9 & 1) != 0) && ((options & 1U) == 0)) {
    return 1;
  }
  LVar1 = first->schema->nodetype;
  plStack_40 = matchset;
  matchset_local = (ly_set *)i;
  i_local = size;
  size_local = (uint *)diff;
  diff_local = (lyd_difflist *)second;
  second_local = first;
  if (LVar1 != LYS_CONTAINER) {
    if (LVar1 == LYS_LEAF) {
      if ((first->child != second->child) ||
         (((options & 1U) != 0 && ((first->field_0x9 & 1) != (second->field_0x9 & 1))))) {
        uVar2 = *i;
        *i = uVar2 + 1;
        iVar4 = lyd_difflist_add(diff,size,uVar2,LYD_DIFF_CHANGED,first,second);
        if (iVar4 != 0) {
          return -1;
        }
      }
      goto LAB_0018bfaf;
    }
    if ((LVar1 != LYS_LEAFLIST) && (LVar1 != LYS_LIST)) {
      if ((LVar1 != LYS_ANYXML) && (LVar1 != LYS_ANYDATA)) {
        pLVar7 = ly_errno_location();
        *pLVar7 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
               ,0xa24);
        return -1;
      }
      if (first[1].schema == (lys_node *)0x0) {
        lyxml_print_mem(&str2,(lyxml_elem *)first[1].schema,0x10);
        plVar5 = (lys_node *)lydict_insert_zc(first->schema->module->ctx,str2);
        first[1].schema = plVar5;
      }
      plVar3 = diff_local;
      str2 = (char *)first[1].schema;
      if (diff_local[2].first == (lyd_node **)0x0) {
        lyxml_print_mem((char **)&anydata,(lyxml_elem *)diff_local[2].first,0x10);
        pplVar6 = (lyd_node **)
                  lydict_insert_zc((ly_ctx *)**(undefined8 **)(plVar3->type + 0xc),(char *)anydata);
        plVar3[2].first = pplVar6;
      }
      anydata = (lyd_node_anydata *)plVar3[2].first;
      if ((lyd_node_anydata *)str2 != anydata) {
        uVar2 = matchset_local->size;
        matchset_local->size = uVar2 + 1;
        iVar4 = lyd_difflist_add((lyd_difflist *)size_local,i_local,uVar2,LYD_DIFF_CHANGED,
                                 second_local,(lyd_node *)diff_local);
        if (iVar4 != 0) {
          return -1;
        }
      }
      goto LAB_0018bfaf;
    }
    str1._4_4_ = lyd_list_equal(first,second,0,(uint)((options & 1U) != 0),0);
    if (str1._4_4_ == -1) {
      return -1;
    }
    if (str1._4_4_ == 0) {
      return 1;
    }
    if ((second_local->schema->flags & 0x100) != 0) {
      diff_ordset_insert(second_local,ordset);
    }
  }
  *(byte *)&diff_local->first = *(byte *)&diff_local->first | 0x80;
  ly_set_add(plStack_40,second_local,1);
LAB_0018bfaf:
  second_local->validity = second_local->validity | 0x80;
  return 0;
}

Assistant:

static int
lyd_diff_compare(struct lyd_node *first, struct lyd_node *second,
                 struct lyd_difflist *diff, unsigned int *size, unsigned int *i, struct ly_set *matchset,
                 struct ly_set *ordset, int options)
{
    int rc;
    char *str1 = NULL, *str2 = NULL;
    struct lyd_node_anydata *anydata;

    if (first->dflt && !(options & LYD_DIFFOPT_WITHDEFAULTS)) {
        /* the second one cannot be default (see lyd_diff()),
         * so the nodes differs (first one is default node) */
        return 1;
    }

    switch (first->schema->nodetype) {
    case LYS_LEAFLIST:
    case LYS_LIST:
        rc = lyd_list_equal(first, second, 0, (options & LYD_DIFFOPT_WITHDEFAULTS ? 1 : 0), 0);
        if (rc == -1) {
            return -1;
        } else if (!rc) {
            /* list instances differs */
            return 1;
        } /* else matches */

        /* additional work for future move matching in case of user ordered lists */
        if (first->schema->flags & LYS_USERORDERED) {
            diff_ordset_insert(first, ordset);
        }

        /* no break, fall through */
    case LYS_CONTAINER:
        second->validity |= LYD_VAL_INUSE;
        /* remember the matching node in first for keeping correct pointer in first
         * for comparing when passing through the second tree in lyd_diff().
         * Duplicities are not allowed actually, but they cannot happen since single
         * node can match only one node in the other tree */
        ly_set_add(matchset, first, LY_SET_OPT_USEASLIST);
        break;
    case LYS_LEAF:
        /* check for leaf's modification */
        if (!ly_strequal(((struct lyd_node_leaf_list * )first)->value_str,
                         ((struct lyd_node_leaf_list * )second)->value_str, 1)
                || ((options & LYD_DIFFOPT_WITHDEFAULTS) && (first->dflt != second->dflt))) {
            if (lyd_difflist_add(diff, size, (*i)++, LYD_DIFF_CHANGED, first, second)) {
               return -1;
            }
        }
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* check for anydata/anyxml's modification */
        anydata = (struct lyd_node_anydata *)first;
        if (!anydata->value.str) {
            lyxml_print_mem(&str1, anydata->value.xml, LYXML_PRINT_SIBLINGS);
            anydata->value.str = lydict_insert_zc(anydata->schema->module->ctx, str1);
        }
        str1 = (char *)anydata->value.str;

        anydata = (struct lyd_node_anydata *)second;
        if (!anydata->value.str) {
            lyxml_print_mem(&str2, anydata->value.xml, LYXML_PRINT_SIBLINGS);
            anydata->value.str = lydict_insert_zc(anydata->schema->module->ctx, str2);
        }
        str2 = (char *)anydata->value.str;

        if (!ly_strequal(str1, str2, 1)) {
            if (lyd_difflist_add(diff, size, (*i)++, LYD_DIFF_CHANGED, first, second)) {
                return -1;
            }
        }
        break;
    default:
        LOGINT;
        return -1;
    }

    /* mark both that they have matching instance in the other tree */
    first->validity |= LYD_VAL_INUSE;

    return 0;
}